

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void anon_unknown.dwarf_889438::InheritQualifiers(TQualifier *child,TQualifier *parent)

{
  TQualifier *parent_local;
  TQualifier *child_local;
  
  if ((uint)((ulong)*(undefined8 *)&child->field_0x8 >> 0x3d) == 0) {
    *(ulong *)&child->field_0x8 =
         *(ulong *)&child->field_0x8 & 0x1fffffffffffffff |
         *(ulong *)&parent->field_0x8 & 0xe000000000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x1c & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffffffefffffff | 0x10000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x1f & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffffff7fffffff | 0x80000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x1d & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffffffdfffffff | 0x20000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x25 & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffffdfffffffff | 0x2000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x26 & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffffbfffffffff | 0x4000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x29 & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xfffffdffffffffff | 0x20000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x2a & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xfffffbffffffffff | 0x40000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x2b & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xfffff7ffffffffff | 0x80000000000;
  }
  if (((uint)*(undefined8 *)&parent->field_0x8 & 0x7f) == 0xf) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffffffffffff80 | 0xf;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x2c & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffefffffffffff | 0x100000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x2d & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffdfffffffffff | 0x200000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x31 & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xfffdffffffffffff | 0x2000000000000
    ;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x34 & 1) != 0) {
    *(ulong *)&child->field_0x8 =
         *(ulong *)&child->field_0x8 & 0xffefffffffffffff | 0x10000000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x35 & 1) != 0) {
    *(ulong *)&child->field_0x8 =
         *(ulong *)&child->field_0x8 & 0xffdfffffffffffff | 0x20000000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x36 & 1) != 0) {
    *(ulong *)&child->field_0x8 =
         *(ulong *)&child->field_0x8 & 0xffbfffffffffffff | 0x40000000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x37 & 1) != 0) {
    *(ulong *)&child->field_0x8 =
         *(ulong *)&child->field_0x8 & 0xff7fffffffffffff | 0x80000000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x38 & 1) != 0) {
    *(ulong *)&child->field_0x8 =
         *(ulong *)&child->field_0x8 & 0xfeffffffffffffff | 0x100000000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x39 & 1) != 0) {
    *(ulong *)&child->field_0x8 =
         *(ulong *)&child->field_0x8 & 0xfdffffffffffffff | 0x200000000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x32 & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xfffbffffffffffff | 0x4000000000000
    ;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x33 & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xfff7ffffffffffff | 0x8000000000000
    ;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x2e & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffffbfffffffffff | 0x400000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x2f & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xffff7fffffffffff | 0x800000000000;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x30 & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xfffeffffffffffff | 0x1000000000000
    ;
  }
  if ((*(ulong *)&parent->field_0x8 >> 0x21 & 1) != 0) {
    *(ulong *)&child->field_0x8 = *(ulong *)&child->field_0x8 & 0xfffffffdffffffff | 0x200000000;
  }
  return;
}

Assistant:

void InheritQualifiers(glslang::TQualifier& child, const glslang::TQualifier& parent)
{
    if (child.layoutMatrix == glslang::ElmNone)
        child.layoutMatrix = parent.layoutMatrix;

    if (parent.invariant)
        child.invariant = true;
    if (parent.flat)
        child.flat = true;
    if (parent.centroid)
        child.centroid = true;
    if (parent.nopersp)
        child.nopersp = true;
    if (parent.explicitInterp)
        child.explicitInterp = true;
    if (parent.perPrimitiveNV)
        child.perPrimitiveNV = true;
    if (parent.perViewNV)
        child.perViewNV = true;
    if (parent.perTaskNV)
        child.perTaskNV = true;
    if (parent.storage == glslang::EvqtaskPayloadSharedEXT)
        child.storage = glslang::EvqtaskPayloadSharedEXT;
    if (parent.patch)
        child.patch = true;
    if (parent.sample)
        child.sample = true;
    if (parent.coherent)
        child.coherent = true;
    if (parent.devicecoherent)
        child.devicecoherent = true;
    if (parent.queuefamilycoherent)
        child.queuefamilycoherent = true;
    if (parent.workgroupcoherent)
        child.workgroupcoherent = true;
    if (parent.subgroupcoherent)
        child.subgroupcoherent = true;
    if (parent.shadercallcoherent)
        child.shadercallcoherent = true;
    if (parent.nonprivate)
        child.nonprivate = true;
    if (parent.volatil)
        child.volatil = true;
    if (parent.nontemporal)
        child.nontemporal = true;
    if (parent.restrict)
        child.restrict = true;
    if (parent.readonly)
        child.readonly = true;
    if (parent.writeonly)
        child.writeonly = true;
    if (parent.nonUniform)
        child.nonUniform = true;
}